

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void QtPromisePrivate::PromiseFulfill<QtPromise::QPromise<QString>>::
     call<QtPromise::QPromiseResolve<QString>,QtPromise::QPromiseReject<QString>>
               (QPromise<QString> *promise,QPromiseResolve<QString> *resolve,
               QPromiseReject<QString> *reject)

{
  QPromiseReject<QString> *pQVar1;
  QPromiseResolve<QString> *fulfilled;
  bool bVar2;
  PromiseValue<QString> *value;
  PromiseData<QString> *pPVar3;
  PromiseError *error;
  QPromiseReject<QString> local_70;
  QPromise<QString> local_68 [2];
  anon_class_24_2_d74e9aa7 local_48;
  QPromiseBase<QString> local_30;
  QPromiseReject<QString> *local_20;
  QPromiseReject<QString> *reject_local;
  QPromiseResolve<QString> *resolve_local;
  QPromise<QString> *promise_local;
  
  local_20 = reject;
  reject_local = (QPromiseReject<QString> *)resolve;
  resolve_local = (QPromiseResolve<QString> *)promise;
  bVar2 = QtPromise::QPromiseBase<QString>::isFulfilled(&promise->super_QPromiseBase<QString>);
  pQVar1 = reject_local;
  if (bVar2) {
    pPVar3 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QString>_>::operator->
                       ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QString>_> *)
                        (resolve_local + 1));
    value = PromiseData<QString>::value(pPVar3);
    QtPromise::QPromiseResolve<QString>::operator()((QPromiseResolve<QString> *)pQVar1,value);
  }
  else {
    bVar2 = QtPromise::QPromiseBase<QString>::isRejected((QPromiseBase<QString> *)resolve_local);
    fulfilled = resolve_local;
    pQVar1 = local_20;
    if (bVar2) {
      pPVar3 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QString>_>::operator->
                         ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QString>_> *)
                          (resolve_local + 1));
      error = PromiseDataBase<QString,_void_(const_QString_&)>::error
                        (&pPVar3->super_PromiseDataBase<QString,_void_(const_QString_&)>);
      QtPromise::QPromiseReject<QString>::operator()(pQVar1,error);
    }
    else {
      QtPromise::QPromiseResolve<QString>::QPromiseResolve
                ((QPromiseResolve<QString> *)&local_48,(QPromiseResolve<QString> *)reject_local);
      QtPromise::QPromise<QString>::QPromise(&local_48.promise,(QPromise<QString> *)resolve_local);
      QtPromise::QPromiseReject<QString>::QPromiseReject(&local_70,local_20);
      QtPromise::QPromise<QString>::QPromise(local_68,(QPromise<QString> *)resolve_local);
      QtPromise::QPromiseBase<QString>::
      then<QtPromisePrivate::PromiseFulfill<QtPromise::QPromise<QString>>::call<QtPromise::QPromiseResolve<QString>,QtPromise::QPromiseReject<QString>>(QtPromise::QPromise<QString>const&,QtPromise::QPromiseResolve<QString>const&,QtPromise::QPromiseReject<QString>const&)::_lambda()_1_,QtPromisePrivate::PromiseFulfill<QtPromise::QPromise<QString>>::call<QtPromise::QPromiseResolve<QString>,QtPromise::QPromiseReject<QString>>(QtPromise::QPromise<QString>const&,QtPromise::QPromiseResolve<QString>const&,QtPromise::QPromiseReject<QString>const&)::_lambda()_2_>
                (&local_30,(anon_class_24_2_e6a34898 *)fulfilled,&local_48);
      QtPromise::QPromise<void>::~QPromise((QPromise<void> *)&local_30);
      call<QtPromise::QPromiseResolve<QString>,QtPromise::QPromiseReject<QString>>(QtPromise::QPromise<QString>const&,QtPromise::QPromiseResolve<QString>const&,QtPromise::QPromiseReject<QString>const&)
      ::{lambda()#2}::~call((_lambda___2_ *)&local_70);
      call<QtPromise::QPromiseResolve<QString>,QtPromise::QPromiseReject<QString>>(QtPromise::QPromise<QString>const&,QtPromise::QPromiseResolve<QString>const&,QtPromise::QPromiseReject<QString>const&)
      ::{lambda()#1}::~call((_lambda___1_ *)&local_48);
    }
  }
  return;
}

Assistant:

static void
    call(const QtPromise::QPromise<T>& promise, const TResolve& resolve, const TReject& reject)
    {
        if (promise.isFulfilled()) {
            resolve(promise.m_d->value());
        } else if (promise.isRejected()) {
            reject(promise.m_d->error());
        } else {
            promise.then(
                [=]() {
                    resolve(promise.m_d->value());
                },
                [=]() { // catch all
                    reject(promise.m_d->error());
                });
        }
    }